

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

ggml_tensor * __thiscall llm_graph_context::build_inp_attn_scale(llm_graph_context *this)

{
  ggml_tensor *pgVar1;
  _Head_base<0UL,_llm_graph_input_i_*,_false> _Var2;
  _func_int **pp_Var3;
  pointer *__ptr;
  _Head_base<0UL,_llm_graph_input_i_*,_false> local_28;
  _Head_base<0UL,_llm_graph_input_i_*,_false> local_20;
  long local_18;
  
  local_18 = (ulong)(this->arch == LLM_ARCH_QWEN2VL) * 3 + 1;
  std::make_unique<llm_graph_input_attn_temp,long,unsigned_int_const&,float_const&>
            ((long *)&local_20,(uint *)&local_18,(float *)&this->hparams->n_attn_temp_floor_scale);
  _Var2._M_head_impl = local_20._M_head_impl;
  pp_Var3 = (_func_int **)
            ggml_new_tensor_3d(this->ctx0,0,1,1,
                               (long)this->n_tokens << (this->arch == LLM_ARCH_QWEN2VL) * '\x02');
  _Var2._M_head_impl[1]._vptr_llm_graph_input_i = pp_Var3;
  ggml_set_input(pp_Var3);
  local_28._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (llm_graph_input_i *)0x0;
  llm_graph_result::add_input
            ((this->res)._M_t.
             super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
             super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
             super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl,
             (llm_graph_input_ptr *)&local_28);
  if (local_28._M_head_impl != (llm_graph_input_i *)0x0) {
    (*(local_28._M_head_impl)->_vptr_llm_graph_input_i[1])();
  }
  local_28._M_head_impl = (llm_graph_input_i *)0x0;
  pgVar1 = (ggml_tensor *)_Var2._M_head_impl[1]._vptr_llm_graph_input_i;
  if (local_20._M_head_impl != (llm_graph_input_i *)0x0) {
    (*(local_20._M_head_impl)->_vptr_llm_graph_input_i[1])();
  }
  return pgVar1;
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_attn_scale() const {
    auto inp = std::make_unique<llm_graph_input_attn_temp>(n_pos_per_token(), hparams.n_attn_temp_floor_scale, hparams.f_attn_temp_scale);

    auto & cur = inp->attn_scale;

    cur = ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, 1, 1, n_tokens*n_pos_per_token());
    ggml_set_input(cur);

    res->add_input(std::move(inp));

    return cur;
}